

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int maybe_new_socket(uv_tcp_t *handle,int domain,int flags)

{
  int iVar1;
  int err;
  int sockfd;
  int flags_local;
  int domain_local;
  uv_tcp_t *handle_local;
  
  if ((domain == 0) || ((handle->io_watcher).fd != -1)) {
    handle->flags = flags | handle->flags;
    handle_local._4_4_ = 0;
  }
  else {
    handle_local._4_4_ = uv__socket(domain,1,0);
    if (-1 < handle_local._4_4_) {
      iVar1 = uv__stream_open((uv_stream_t *)handle,handle_local._4_4_,flags);
      if (iVar1 == 0) {
        handle_local._4_4_ = 0;
      }
      else {
        uv__close(handle_local._4_4_);
        handle_local._4_4_ = iVar1;
      }
    }
  }
  return handle_local._4_4_;
}

Assistant:

static int maybe_new_socket(uv_tcp_t* handle, int domain, int flags) {
  int sockfd;
  int err;

  if (domain == AF_UNSPEC || uv__stream_fd(handle) != -1) {
    handle->flags |= flags;
    return 0;
  }

  err = uv__socket(domain, SOCK_STREAM, 0);
  if (err < 0)
    return err;
  sockfd = err;

  err = uv__stream_open((uv_stream_t*) handle, sockfd, flags);
  if (err) {
    uv__close(sockfd);
    return err;
  }

  return 0;
}